

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_functional_test.cc
# Opt level: O1

void iterator_inmem_snapshot_seek_test(bool flush_wal)

{
  fdb_status fVar1;
  size_t sVar4;
  size_t sVar5;
  int iVar2;
  uint uVar3;
  size_t sVar6;
  long lVar7;
  fdb_config *doc;
  fdb_config *pfVar8;
  fdb_doc **doc_00;
  fdb_doc **doc_01;
  char *pcVar9;
  undefined7 in_register_00000039;
  fdb_doc **unaff_R12;
  ulong uVar10;
  long unaff_R13;
  void *__s1;
  ulong uVar11;
  size_t unaff_R15;
  fdb_iterator *iterator;
  fdb_doc *rdoc;
  fdb_kvs_handle *snap_db;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_config fconfig;
  fdb_kvs_handle *pfStack_1078;
  uint uStack_106c;
  ulong uStack_1068;
  fdb_iterator *pfStack_1060;
  fdb_file_handle *pfStack_1058;
  fdb_doc **ppfStack_1050;
  fdb_doc *pfStack_1048;
  fdb_kvs_info fStack_1040;
  timeval tStack_1010;
  fdb_kvs_config fStack_1000;
  char acStack_fe8 [256];
  fdb_doc *apfStack_ee8 [101];
  fdb_config fStack_bc0;
  char acStack_ac8 [256];
  char acStack_9c8 [264];
  fdb_doc **ppfStack_8c0;
  char *pcStack_8b8;
  ulong uStack_8b0;
  char *pcStack_8a8;
  long lStack_8a0;
  fdb_doc **ppfStack_898;
  fdb_doc *pfStack_880;
  fdb_kvs_handle *pfStack_878;
  fdb_iterator *pfStack_870;
  fdb_file_handle *pfStack_868;
  fdb_doc *apfStack_860 [10];
  timeval tStack_810;
  fdb_kvs_config fStack_800;
  fdb_config fStack_7e8;
  char acStack_6f0 [256];
  char acStack_5f0 [264];
  fdb_config *pfStack_4e8;
  fdb_doc **ppfStack_4e0;
  long lStack_4d8;
  void *pvStack_4d0;
  size_t sStack_4c8;
  code *pcStack_4c0;
  fdb_iterator *local_4b0;
  fdb_config *local_4a8;
  fdb_kvs_handle *local_4a0;
  fdb_kvs_handle *local_498;
  fdb_file_handle *local_490;
  bool local_484;
  fdb_kvs_config local_480;
  fdb_doc *apfStack_468 [6];
  timeval local_438;
  char local_428 [256];
  fdb_config local_328;
  char local_228 [256];
  fdb_config local_128;
  
  sVar4 = CONCAT71(in_register_00000039,flush_wal) & 0xffffffff;
  __s1 = (void *)0x0;
  pcStack_4c0 = (code *)0x11569c;
  gettimeofday(&local_438,(__timezone_ptr_t)0x0);
  pcStack_4c0 = (code *)0x1156a1;
  memleak_start();
  local_4a8 = (fdb_config *)0x0;
  pcStack_4c0 = (code *)0x1156b2;
  system("rm -rf  iterator_test* > errorlog.txt");
  pfVar8 = &local_128;
  pcStack_4c0 = (code *)0x1156c2;
  fdb_get_default_config();
  pcStack_4c0 = (code *)0x1156cc;
  fdb_get_default_kvs_config();
  local_128.buffercache_size = 0;
  local_128.wal_threshold = 0x400;
  local_128.flags = 1;
  local_128.compaction_threshold = '\0';
  pcStack_4c0 = (code *)0x1156f7;
  fVar1 = fdb_open(&local_490,"./iterator_test1",pfVar8);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    _local_484 = (undefined4)CONCAT71(in_register_00000039,flush_wal);
    pcStack_4c0 = (code *)0x115717;
    fVar1 = fdb_kvs_open_default(local_490,&local_498,&local_480);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00115b0c;
    unaff_R13 = 0;
    uVar11 = 0;
    do {
      pcStack_4c0 = (code *)0x115742;
      sprintf(local_228,"%c2",(ulong)((int)uVar11 + 0x61));
      pcStack_4c0 = (code *)0x11575b;
      sprintf((char *)&local_328,"meta%d",uVar11 & 0xffffffff);
      pcStack_4c0 = (code *)0x115774;
      sprintf(local_428,"body%d",uVar11 & 0xffffffff);
      unaff_R12 = (fdb_doc **)((long)apfStack_468 + unaff_R13);
      pcStack_4c0 = (code *)0x115784;
      sVar4 = strlen(local_228);
      pfVar8 = &local_328;
      pcStack_4c0 = (code *)0x115797;
      unaff_R15 = strlen((char *)pfVar8);
      pcStack_4c0 = (code *)0x1157a7;
      sVar5 = strlen(local_428);
      pcStack_4c0 = (code *)0x1157cc;
      fdb_doc_create(unaff_R12,local_228,sVar4,pfVar8,unaff_R15,local_428,sVar5);
      pcStack_4c0 = (code *)0x1157db;
      fdb_set(local_498,apfStack_468[uVar11]);
      uVar11 = uVar11 + 1;
      unaff_R13 = unaff_R13 + 8;
    } while (uVar11 != 5);
    pcStack_4c0 = (code *)0x1157fb;
    fdb_commit(local_490,local_484);
    pcStack_4c0 = (code *)0x115811;
    fVar1 = fdb_snapshot_open(local_498,&local_4a0,0xffffffffffffffff);
    __s1 = (void *)0x5;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00115b11;
    pcStack_4c0 = (code *)0x115831;
    fVar1 = fdb_set_log_callback(local_498,logCallbackFunc,"iterator_inmem_snapshot_seek_test");
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00115b16;
    pfVar8 = (fdb_config *)&local_4b0;
    pcStack_4c0 = (code *)0x11586b;
    fdb_iterator_init(local_4a0,(fdb_iterator **)pfVar8,"b2",2,"d2",2,0xe);
    pcStack_4c0 = (code *)0x115884;
    fVar1 = fdb_iterator_seek(local_4b0,"c1",2,'\x01');
    if (fVar1 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00115b1b;
    pcStack_4c0 = (code *)0x1158a5;
    fVar1 = fdb_iterator_seek(local_4b0,"c3",2,'\0');
    if (fVar1 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00115b20;
    pfVar8 = (fdb_config *)&local_4b0;
    pcStack_4c0 = (code *)0x1158bb;
    fdb_iterator_close(local_4b0);
    pcStack_4c0 = (code *)0x1158e8;
    fdb_iterator_init(local_4a0,(fdb_iterator **)pfVar8,"b3",2,"d1",2,0xe);
    pcStack_4c0 = (code *)0x115901;
    fVar1 = fdb_iterator_seek(local_4b0,"c1",2,'\x01');
    if (fVar1 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00115b25;
    pcStack_4c0 = (code *)0x115922;
    fVar1 = fdb_iterator_seek(local_4b0,"c3",2,'\0');
    if (fVar1 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00115b2a;
    pfVar8 = (fdb_config *)&local_4b0;
    pcStack_4c0 = (code *)0x115938;
    fdb_iterator_close(local_4b0);
    pcStack_4c0 = (code *)0x115965;
    fdb_iterator_init(local_4a0,(fdb_iterator **)pfVar8,"b0",2,"e2",2,0xe);
    pcStack_4c0 = (code *)0x11596d;
    fVar1 = fdb_iterator_seek_to_max(local_4b0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00115b2f;
    pcStack_4c0 = (code *)0x115984;
    fVar1 = fdb_iterator_get(local_4b0,(fdb_doc **)&local_4a8);
    doc = local_4a8;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00115b34;
    sVar5._0_2_ = local_4a8->chunksize;
    sVar5._2_2_ = *(undefined2 *)&local_4a8->field_0x2;
    sVar5._4_4_ = local_4a8->blocksize;
    __s1 = *(void **)&local_4a8->seqtree_opt;
    pcStack_4c0 = (code *)0x1159a7;
    iVar2 = bcmp(__s1,"d2",sVar5);
    if (iVar2 != 0) goto LAB_00115b39;
    pcStack_4c0 = (code *)0x1159b7;
    fdb_doc_free((fdb_doc *)doc);
    local_4a8 = (fdb_config *)0x0;
    pcStack_4c0 = (code *)0x1159d8;
    fVar1 = fdb_iterator_seek(local_4b0,"e2",2,'\0');
    if (fVar1 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00115b41;
    pcStack_4c0 = (code *)0x1159eb;
    fVar1 = fdb_iterator_seek_to_min(local_4b0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00115b46;
    pcStack_4c0 = (code *)0x115a02;
    fVar1 = fdb_iterator_get(local_4b0,(fdb_doc **)&local_4a8);
    pfVar8 = local_4a8;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00115b4b;
    sVar6._0_2_ = local_4a8->chunksize;
    sVar6._2_2_ = *(undefined2 *)&local_4a8->field_0x2;
    sVar6._4_4_ = local_4a8->blocksize;
    __s1 = *(void **)&local_4a8->seqtree_opt;
    pcStack_4c0 = (code *)0x115a25;
    iVar2 = bcmp(__s1,"c2",sVar6);
    if (iVar2 != 0) goto LAB_00115b50;
    pcStack_4c0 = (code *)0x115a35;
    fdb_doc_free((fdb_doc *)pfVar8);
    pcStack_4c0 = (code *)0x115a50;
    fVar1 = fdb_iterator_seek(local_4b0,"b0",2,'\x01');
    if (fVar1 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00115b58;
    pcStack_4c0 = (code *)0x115a74;
    fVar1 = fdb_iterator_seek(local_4b0,"b0",2,'\x01');
    if (fVar1 == FDB_RESULT_ITERATOR_FAIL) {
      pcStack_4c0 = (code *)0x115a87;
      fdb_iterator_close(local_4b0);
      pcStack_4c0 = (code *)0x115a91;
      fdb_kvs_close(local_498);
      pcStack_4c0 = (code *)0x115a9b;
      fdb_kvs_close(local_4a0);
      pcStack_4c0 = (code *)0x115aa5;
      fdb_close(local_490);
      lVar7 = 0;
      do {
        pcStack_4c0 = (code *)0x115ab1;
        fdb_doc_free(apfStack_468[lVar7]);
        lVar7 = lVar7 + 1;
      } while (lVar7 != 5);
      pcStack_4c0 = (code *)0x115abf;
      fdb_shutdown();
      pcStack_4c0 = (code *)0x115ac4;
      memleak_end();
      pcVar9 = "%s PASSED\n";
      if (iterator_inmem_snapshot_seek_test(bool)::__test_pass != '\0') {
        pcVar9 = "%s FAILED\n";
      }
      pcStack_4c0 = (code *)0x115af5;
      fprintf(_stderr,pcVar9,"in-memory snapshot seek test");
      return;
    }
  }
  else {
    pcStack_4c0 = (code *)0x115b0c;
    iterator_inmem_snapshot_seek_test();
LAB_00115b0c:
    pcStack_4c0 = (code *)0x115b11;
    iterator_inmem_snapshot_seek_test();
LAB_00115b11:
    pcStack_4c0 = (code *)0x115b16;
    iterator_inmem_snapshot_seek_test();
LAB_00115b16:
    pcStack_4c0 = (code *)0x115b1b;
    iterator_inmem_snapshot_seek_test();
LAB_00115b1b:
    pcStack_4c0 = (code *)0x115b20;
    iterator_inmem_snapshot_seek_test();
LAB_00115b20:
    pcStack_4c0 = (code *)0x115b25;
    iterator_inmem_snapshot_seek_test();
LAB_00115b25:
    pcStack_4c0 = (code *)0x115b2a;
    iterator_inmem_snapshot_seek_test();
LAB_00115b2a:
    pcStack_4c0 = (code *)0x115b2f;
    iterator_inmem_snapshot_seek_test();
LAB_00115b2f:
    pcStack_4c0 = (code *)0x115b34;
    iterator_inmem_snapshot_seek_test();
LAB_00115b34:
    doc = pfVar8;
    pcStack_4c0 = (code *)0x115b39;
    iterator_inmem_snapshot_seek_test();
LAB_00115b39:
    pcStack_4c0 = (code *)0x115b41;
    iterator_inmem_snapshot_seek_test();
LAB_00115b41:
    pcStack_4c0 = (code *)0x115b46;
    iterator_inmem_snapshot_seek_test();
LAB_00115b46:
    pcStack_4c0 = (code *)0x115b4b;
    iterator_inmem_snapshot_seek_test();
LAB_00115b4b:
    pfVar8 = doc;
    pcStack_4c0 = (code *)0x115b50;
    iterator_inmem_snapshot_seek_test();
LAB_00115b50:
    pcStack_4c0 = (code *)0x115b58;
    iterator_inmem_snapshot_seek_test();
LAB_00115b58:
    pcStack_4c0 = (code *)0x115b5d;
    iterator_inmem_snapshot_seek_test();
  }
  pcStack_4c0 = iterator_no_deletes_test;
  iterator_inmem_snapshot_seek_test();
  ppfStack_898 = (fdb_doc **)0x115b82;
  pfStack_4e8 = pfVar8;
  ppfStack_4e0 = unaff_R12;
  lStack_4d8 = unaff_R13;
  pvStack_4d0 = __s1;
  sStack_4c8 = unaff_R15;
  pcStack_4c0 = (code *)sVar4;
  gettimeofday(&tStack_810,(__timezone_ptr_t)0x0);
  ppfStack_898 = (fdb_doc **)0x115b87;
  memleak_start();
  pfStack_880 = (fdb_doc *)0x0;
  ppfStack_898 = (fdb_doc **)0x115b9c;
  system("rm -rf  iterator_test* > errorlog.txt");
  ppfStack_898 = (fdb_doc **)0x115bac;
  fdb_get_default_config();
  ppfStack_898 = (fdb_doc **)0x115bbc;
  fdb_get_default_kvs_config();
  fStack_7e8.wal_threshold = 0x400;
  fStack_7e8.flags = 1;
  fStack_7e8.compaction_threshold = '\0';
  ppfStack_898 = (fdb_doc **)0x115be6;
  fdb_open(&pfStack_868,"./iterator_test",&fStack_7e8);
  ppfStack_898 = (fdb_doc **)0x115bfd;
  fdb_kvs_open(pfStack_868,&pfStack_878,"all_docs",&fStack_800);
  lVar7 = 0;
  uVar11 = 0;
  do {
    ppfStack_898 = (fdb_doc **)0x115c27;
    sprintf(acStack_5f0,"key%d",uVar11 & 0xffffffff);
    ppfStack_898 = (fdb_doc **)0x115c3b;
    sprintf(acStack_6f0,"body%d",uVar11 & 0xffffffff);
    doc_01 = (fdb_doc **)((long)apfStack_860 + lVar7);
    ppfStack_898 = (fdb_doc **)0x115c4b;
    sVar4 = strlen(acStack_5f0);
    ppfStack_898 = (fdb_doc **)0x115c56;
    sVar5 = strlen(acStack_6f0);
    ppfStack_898 = (fdb_doc **)0x115c70;
    fdb_doc_create(doc_01,acStack_5f0,sVar4,(void *)0x0,0,acStack_6f0,sVar5);
    ppfStack_898 = (fdb_doc **)0x115c7f;
    fdb_set(pfStack_878,apfStack_860[uVar11]);
    uVar11 = uVar11 + 1;
    lVar7 = lVar7 + 8;
  } while (uVar11 != 10);
  doc_00 = (fdb_doc **)0x0;
  do {
    ppfStack_898 = (fdb_doc **)0x115ca4;
    fVar1 = fdb_del_kv(pfStack_878,apfStack_860[(long)doc_00]->key,
                       apfStack_860[(long)doc_00]->keylen);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      ppfStack_898 = (fdb_doc **)0x115e0c;
      iterator_no_deletes_test();
      goto LAB_00115e0c;
    }
    doc_00 = (fdb_doc **)((long)doc_00 + 1);
  } while (doc_00 != (fdb_doc **)0xa);
  ppfStack_898 = (fdb_doc **)0x115cc1;
  fdb_commit(pfStack_868,'\0');
  ppfStack_898 = (fdb_doc **)0x115cd0;
  fVar1 = fdb_set(pfStack_878,apfStack_860[2]);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    doc_00 = &pfStack_880;
    ppfStack_898 = (fdb_doc **)0x115d01;
    fdb_doc_create(doc_00,apfStack_860[2]->key,apfStack_860[2]->keylen,(void *)0x0,0,(void *)0x0,0);
    ppfStack_898 = (fdb_doc **)0x115d0e;
    fVar1 = fdb_get(pfStack_878,pfStack_880);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00115e11;
    if (pfStack_880->deleted != false) {
      ppfStack_898 = (fdb_doc **)0x115d2b;
      iterator_no_deletes_test();
    }
    ppfStack_898 = (fdb_doc **)0x115d35;
    fdb_doc_free(pfStack_880);
    pfStack_880 = (fdb_doc *)0x0;
    ppfStack_898 = (fdb_doc **)0x115d5e;
    fVar1 = fdb_iterator_init(pfStack_878,&pfStack_870,(void *)0x0,0,(void *)0x0,0,2);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      ppfStack_898 = (fdb_doc **)0x115d75;
      fVar1 = fdb_iterator_get(pfStack_870,&pfStack_880);
      if (fVar1 == FDB_RESULT_SUCCESS) {
        ppfStack_898 = (fdb_doc **)0x115d87;
        fdb_doc_free(pfStack_880);
        ppfStack_898 = (fdb_doc **)0x115d91;
        fdb_iterator_close(pfStack_870);
        lVar7 = 0;
        do {
          ppfStack_898 = (fdb_doc **)0x115d9d;
          fdb_doc_free(apfStack_860[lVar7]);
          lVar7 = lVar7 + 1;
        } while (lVar7 != 10);
        ppfStack_898 = (fdb_doc **)0x115db0;
        fdb_kvs_close(pfStack_878);
        ppfStack_898 = (fdb_doc **)0x115dba;
        fdb_close(pfStack_868);
        ppfStack_898 = (fdb_doc **)0x115dbf;
        fdb_shutdown();
        ppfStack_898 = (fdb_doc **)0x115dc4;
        memleak_end();
        pcVar9 = "%s PASSED\n";
        if (iterator_no_deletes_test()::__test_pass != '\0') {
          pcVar9 = "%s FAILED\n";
        }
        ppfStack_898 = (fdb_doc **)0x115df5;
        fprintf(_stderr,pcVar9,"iterator no deletes test");
        return;
      }
      goto LAB_00115e1b;
    }
  }
  else {
LAB_00115e0c:
    ppfStack_898 = (fdb_doc **)0x115e11;
    iterator_no_deletes_test();
LAB_00115e11:
    ppfStack_898 = (fdb_doc **)0x115e16;
    iterator_no_deletes_test();
  }
  ppfStack_898 = (fdb_doc **)0x115e1b;
  iterator_no_deletes_test();
LAB_00115e1b:
  ppfStack_898 = (fdb_doc **)iterator_set_del_docs_test;
  iterator_no_deletes_test();
  ppfStack_8c0 = doc_00;
  pcStack_8b8 = acStack_6f0;
  uStack_8b0 = uVar11;
  pcStack_8a8 = acStack_5f0;
  lStack_8a0 = lVar7;
  ppfStack_898 = doc_01;
  gettimeofday(&tStack_1010,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  system("rm -rf  iterator_test* > errorlog.txt");
  fStack_bc0.wal_threshold = 0x400;
  fStack_bc0.flags = 1;
  fStack_bc0.compaction_threshold = '\n';
  fStack_bc0.purging_interval = 1;
  fdb_open(&pfStack_1058,"./iterator_test1",&fStack_bc0);
  fdb_kvs_open(pfStack_1058,&pfStack_1078,"kv1",&fStack_1000);
  uStack_1068 = 0;
  uVar3 = 0;
  do {
    lVar7 = 0;
    uVar11 = 0;
    uStack_106c = uVar3;
    do {
      uVar3 = uStack_106c;
      sprintf(acStack_9c8,"key%02d%03d",(ulong)uStack_106c,uVar11 & 0xffffffff);
      sprintf(acStack_ac8,"meta%02d%03d",(ulong)uVar3,uVar11 & 0xffffffff);
      sprintf(acStack_fe8,"body%02d%03d",(ulong)uVar3,uVar11 & 0xffffffff);
      ppfStack_1050 = (fdb_doc **)((long)apfStack_ee8 + lVar7);
      sVar4 = strlen(acStack_9c8);
      sVar5 = strlen(acStack_ac8);
      sVar6 = strlen(acStack_fe8);
      fdb_doc_create(ppfStack_1050,acStack_9c8,sVar4,acStack_ac8,sVar5,acStack_fe8,sVar6);
      fdb_set(pfStack_1078,apfStack_ee8[uVar11]);
      uVar11 = uVar11 + 1;
      lVar7 = lVar7 + 8;
    } while (uVar11 != 100);
    fdb_commit(pfStack_1058,'\x01');
    lVar7 = 0;
    do {
      fdb_del(pfStack_1078,apfStack_ee8[lVar7 + 0x19]);
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x19);
    uVar11 = uStack_1068 + 0x4b;
    fdb_commit(pfStack_1058,'\x01');
    fdb_get_kvs_info(pfStack_1078,&fStack_1040);
    uStack_1068 = uVar11;
    if (fStack_1040.doc_count != uVar11) {
      uVar10 = 0;
      fdb_iterator_init(pfStack_1078,&pfStack_1060,(void *)0x0,0,(void *)0x0,0,0);
      do {
        fdb_iterator_get(pfStack_1060,&pfStack_1048);
        uVar10 = (ulong)((int)uVar10 + (pfStack_1048->deleted ^ 1));
        fdb_doc_free(pfStack_1048);
        fVar1 = fdb_iterator_next(pfStack_1060);
      } while (fVar1 != FDB_RESULT_ITERATOR_FAIL);
      fdb_iterator_close(pfStack_1060);
      uVar11 = uStack_1068;
      printf("dbdocs(%d) expected(%d)\n",uVar10,uStack_1068 & 0xffffffff);
    }
    if (fStack_1040.doc_count != uVar11) {
      iterator_set_del_docs_test();
    }
    lVar7 = 0;
    do {
      fdb_doc_free(apfStack_ee8[lVar7]);
      lVar7 = lVar7 + 1;
    } while (lVar7 != 100);
    uVar3 = uStack_106c + 1;
  } while (uVar3 != 0x14);
  fdb_kvs_close(pfStack_1078);
  fdb_close(pfStack_1058);
  fdb_shutdown();
  memleak_end();
  pcVar9 = "%s PASSED\n";
  if (iterator_set_del_docs_test()::__test_pass != '\0') {
    pcVar9 = "%s FAILED\n";
  }
  fprintf(_stderr,pcVar9,"iterator set del docs");
  return;
}

Assistant:

void iterator_inmem_snapshot_seek_test(bool flush_wal)
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 5;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_kvs_handle *snap_db;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;
    fdb_iterator *iterator;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous mvcc_test files
    r = system(SHELL_DEL" iterator_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;

    // open db
    status = fdb_open(&dbfile, "./iterator_test1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // ------- Setup test ----------------------------------
    for (i=0; i<n; i++){
        sprintf(keybuf, "%c2",(char)i + 'a');
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    if (flush_wal) {
        fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    } else {
        fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    }
    // ---------- Snapshot tests begin -----------------------
    // WAL items are not flushed...
    status = fdb_snapshot_open(db, &snap_db, FDB_SNAPSHOT_INMEM);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "iterator_inmem_snapshot_seek_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // create an iterator on the snapshot for full range
    fdb_iterator_init(snap_db, &iterator, (void*)"b2", 2, (void*)"d2", 2,
                      FDB_ITR_NO_DELETES|
                      FDB_ITR_SKIP_MAX_KEY|
                      FDB_ITR_SKIP_MIN_KEY);

    // seek to non-existent key that happens to land on the start key which
    // should not be returned since we have passed ITR_SKIP_MIN_KEY
    status = fdb_iterator_seek(iterator, "c1", 2, FDB_ITR_SEEK_LOWER);
    TEST_CHK(status == FDB_RESULT_ITERATOR_FAIL);

    // seek to non-existent key that happens to land on the end key which
    // should not be returned since we have passed ITR_SKIP_MAX_KEY
    status = fdb_iterator_seek(iterator, "c3", 2, FDB_ITR_SEEK_HIGHER);
    TEST_CHK(status == FDB_RESULT_ITERATOR_FAIL);

    fdb_iterator_close(iterator);

    // create an iterator on the snapshot for full range
    fdb_iterator_init(snap_db, &iterator, (void*)"b3", 2, (void*)"d1", 2,
                      FDB_ITR_NO_DELETES|
                      FDB_ITR_SKIP_MAX_KEY|
                      FDB_ITR_SKIP_MIN_KEY);

    // seek to non-existent key that happens to land on key that is
    // smaller than the start key which should not be returned.
    status = fdb_iterator_seek(iterator, "c1", 2, FDB_ITR_SEEK_LOWER);
    TEST_CHK(status == FDB_RESULT_ITERATOR_FAIL);

    // seek to non-existent key that happens to be land on key larger than
    // end key which should not be returned.
    status = fdb_iterator_seek(iterator, "c3", 2, FDB_ITR_SEEK_HIGHER);
    TEST_CHK(status == FDB_RESULT_ITERATOR_FAIL);

    fdb_iterator_close(iterator);

    // create an iterator on the snapshot for just 3 items within range
    fdb_iterator_init(snap_db, &iterator, (void*)"b0", 2, (void*)"e2", 2,
                      FDB_ITR_NO_DELETES|
                      FDB_ITR_SKIP_MAX_KEY|
                      FDB_ITR_SKIP_MIN_KEY);

    // seek to max key but skip max key
    // should return a key for fdb_iterator_seek_to_max
    status = fdb_iterator_seek_to_max(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    TEST_CMP(rdoc->key, "d2", rdoc->keylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // But same attempt with regular seek to max key
    // no key should be returned since we want to skip max key
    status = fdb_iterator_seek(iterator, "e2", 2, FDB_ITR_SEEK_HIGHER);
    TEST_CHK(status == FDB_RESULT_ITERATOR_FAIL);

    // seek to min key but skip min key
    // should return a key for fdb_iterator_seek_to_min
    status = fdb_iterator_seek_to_min(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    TEST_CMP(rdoc->key, "c2", rdoc->keylen);
    fdb_doc_free(rdoc);

    // But same attempt with regular seek to min key
    // no key should be returned since we want to skip min key
    status = fdb_iterator_seek(iterator, "b0", 2, FDB_ITR_SEEK_LOWER);
    TEST_CHK(status == FDB_RESULT_ITERATOR_FAIL);

    // seek to key outside the range that happens to land on non-existent key
    // no key should be returned
    status = fdb_iterator_seek(iterator, "b0", 2, FDB_ITR_SEEK_LOWER);
    TEST_CHK(status == FDB_RESULT_ITERATOR_FAIL);

    fdb_iterator_close(iterator);

    // close db handle
    fdb_kvs_close(db);
    // close snapshot handle
    fdb_kvs_close(snap_db);

    // close db file
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("in-memory snapshot seek test");
}